

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O3

bool __thiscall ON_AngleValue::Read(ON_AngleValue *this,ON_BinaryArchive *archive)

{
  undefined1 uVar1;
  double dVar2;
  bool bVar3;
  AngleUnitSystem AVar4;
  LengthUnitSystem LVar5;
  StringFormat SVar6;
  byte bVar7;
  uint u;
  uint context_length_unit_system_as_unsigned;
  uint angle_unit_system_as_unsigned;
  int content_version;
  uint local_30;
  uint local_2c;
  uint local_28;
  int local_24;
  
  dVar2 = Unset.m_angle;
  LVar5 = Unset.m_context_length_unit_system;
  SVar6 = Unset.m_string_format;
  AVar4 = Unset.m_angle_unit_system;
  uVar1 = Unset._7_1_;
  this->m_context_locale_id = Unset.m_context_locale_id;
  this->m_context_length_unit_system = LVar5;
  this->m_string_format = SVar6;
  this->m_angle_unit_system = AVar4;
  this->field_0x7 = uVar1;
  this->m_angle = dVar2;
  ON_wString::operator=(&this->m_angle_as_string,&Unset.m_angle_as_string);
  local_24 = 0;
  bVar3 = ON_BinaryArchive::BeginRead3dmAnonymousChunk(archive,&local_24);
  if (!bVar3) {
    return false;
  }
  bVar3 = ON_BinaryArchive::ReadDouble(archive,&this->m_angle);
  if (bVar3) {
    local_28 = (uint)this->m_angle_unit_system;
    bVar3 = ON_BinaryArchive::ReadInt(archive,&local_28);
    if (bVar3) {
      AVar4 = ON::AngleUnitSystemFromUnsigned(local_28);
      this->m_angle_unit_system = AVar4;
      local_2c = (uint)this->m_context_length_unit_system;
      bVar3 = ON_BinaryArchive::ReadInt(archive,&local_2c);
      bVar7 = 0;
      if (!bVar3) goto LAB_005c1233;
      LVar5 = ON::LengthUnitSystemFromUnsigned(local_2c);
      if (LVar5 == Unset) {
        LVar5 = None;
      }
      this->m_context_length_unit_system = LVar5;
      bVar3 = ON_BinaryArchive::ReadInt(archive,&this->m_context_locale_id);
      bVar7 = 0;
      if (!bVar3) goto LAB_005c1233;
      bVar3 = ON_BinaryArchive::ReadString(archive,&this->m_angle_as_string);
      if (bVar3) {
        bVar7 = 1;
        if (local_24 < 1) goto LAB_005c1233;
        local_30 = (uint)this->m_string_format;
        bVar3 = ON_BinaryArchive::ReadInt(archive,&local_30);
        if (bVar3) {
          SVar6 = AngleStringFormatFromUnsigned(local_30);
          this->m_string_format = SVar6;
          goto LAB_005c1233;
        }
      }
    }
  }
  bVar7 = 0;
LAB_005c1233:
  bVar3 = ON_BinaryArchive::EndRead3dmChunk(archive);
  return (bool)(bVar3 & bVar7);
}

Assistant:

bool ON_AngleValue::Read(
  class ON_BinaryArchive& archive
)
{
  *this = ON_AngleValue::Unset;
  int content_version = 0;
  if (!archive.BeginRead3dmAnonymousChunk(&content_version))
    return false;

  bool rc = false;
  for (;;)
  {
    if (!archive.ReadDouble(&m_angle))
      break;
    unsigned int angle_unit_system_as_unsigned = static_cast<unsigned int>(m_angle_unit_system);
    if (!archive.ReadInt(&angle_unit_system_as_unsigned))
      break;
    m_angle_unit_system = ON::AngleUnitSystemFromUnsigned(angle_unit_system_as_unsigned);

    unsigned int context_length_unit_system_as_unsigned = static_cast<unsigned int>(m_context_length_unit_system);
    if (!archive.ReadInt(&context_length_unit_system_as_unsigned))
      break;
    m_context_length_unit_system = ON::LengthUnitSystemFromUnsigned(context_length_unit_system_as_unsigned);
    if (ON::LengthUnitSystem::Unset == m_context_length_unit_system)
      m_context_length_unit_system = ON::LengthUnitSystem::None;
    if (!archive.ReadInt(&m_context_locale_id))
      break;

    if (!archive.ReadString(m_angle_as_string))
      break;

    if (content_version >= 1)
    {
      // content version 1 added m_string_format
      unsigned int u = static_cast<unsigned char>(m_string_format);
      if (!archive.ReadInt(&u))
        break;
      m_string_format = ON_AngleValue::AngleStringFormatFromUnsigned(u);
    }


    rc = true;
    break;
  }
  if (!archive.EndRead3dmChunk())
    rc = false;
  return rc;
}